

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::~array_n
          (array_n<char,_3,_std::allocator<char>_> *this)

{
  char *local_20;
  iterator i_1;
  int i;
  uint size;
  array_n<char,_3,_std::allocator<char>_> *this_local;
  
  i_1._4_4_ = 1;
  for (i_1._0_4_ = 0; (int)i_1 < 3; i_1._0_4_ = (int)i_1 + 1) {
    i_1._4_4_ = this->_dims[(int)i_1] * i_1._4_4_;
  }
  if (((this->_array != (char *)0x0) && (this->first != this->last)) && (i_1._4_4_ != 0)) {
    for (local_20 = this->first; local_20 < this->last; local_20 = local_20 + 1) {
      __gnu_cxx::new_allocator<char>::destroy<char>((new_allocator<char> *)this,local_20);
    }
    __gnu_cxx::new_allocator<char>::deallocate
              ((new_allocator<char> *)this,this->first,(long)this->last - (long)this->first);
  }
  this->_array = (char *)0x0;
  std::allocator<char>::~allocator((allocator<char> *)this);
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }